

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_kill_unreachable_bbs(dmr_C *C,entrypoint *ep)

{
  undefined1 local_40 [8];
  ptr_list_iter bbiter__;
  unsigned_long generation;
  basic_block *bb;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  bbiter__._16_8_ = C->L->bb_generation + 1;
  C->L->bb_generation = bbiter__._16_8_;
  mark_bb_reachable(ep->entry->bb,bbiter__._16_8_);
  ptrlist_forward_iterator((ptr_list_iter *)local_40,(ptr_list *)ep->bbs);
  generation = (unsigned_long)ptrlist_iter_next((ptr_list_iter *)local_40);
  while (generation != 0) {
    if (*(long *)(generation + 8) != bbiter__._16_8_) {
      dmrC_kill_bb(C,(basic_block *)generation);
      *(undefined8 *)(generation + 0x18) = 0;
      ptrlist_iter_remove((ptr_list_iter *)local_40);
    }
    generation = (unsigned_long)ptrlist_iter_next((ptr_list_iter *)local_40);
  }
  ptrlist_pack((ptr_list **)&ep->bbs);
  return;
}

Assistant:

void dmrC_kill_unreachable_bbs(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;
	unsigned long generation = ++C->L->bb_generation;

	mark_bb_reachable(ep->entry->bb, generation);
	FOR_EACH_PTR(ep->bbs, bb) {
		if (bb->generation == generation)
			continue;
		/* Mark it as being dead */
		dmrC_kill_bb(C, bb);
		bb->ep = NULL;
		DELETE_CURRENT_PTR(bb);
	} END_FOR_EACH_PTR(bb);
	ptrlist_pack((struct ptr_list **) &ep->bbs);
}